

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_a_vec
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GLint GVar4;
  reference pvVar5;
  int local_48;
  GLint i;
  GLuint attribute_offset;
  GLint attribute;
  GLint group_offset;
  GLuint vertex_offset;
  GLint n_elements;
  GLint attribute_index;
  GLint n_attributes;
  vector<double,_std::allocator<double>_> *out_buffer_data_local;
  GLuint vertex_local;
  GLint n_type_local;
  attributeConfiguration *configuration_local;
  LimitTest *this_local;
  
  iVar1 = configuration->m_n_attributes_per_group;
  iVar2 = configuration->m_n_elements[n_type];
  iVar3 = configuration->m_vertex_length;
  GVar4 = calculateAttributeGroupOffset(this,configuration,n_type);
  for (i = 0; i < iVar1; i = i + 1) {
    for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (out_buffer_data,(ulong)(iVar2 * i + GVar4 + vertex * iVar3 + local_48));
      *pvVar5 = (double)(local_48 + 1 + i + iVar1 * n_type + vertex * 3);
    }
  }
  return;
}

Assistant:

void LimitTest::setAttributes_a_vec(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
									std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	const GLint n_elements		= configuration.m_n_elements[n_type];
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Dvec2 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 3 + 1,
	 n_attribute + gl_VertexID * 3 + 2)*/

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = n_elements * attribute + group_offset;

		for (GLint i = 0; i < n_elements; ++i)
		{
			out_buffer_data[attribute_offset + i] = attribute + attribute_index + vertex * 3 + i + 1;
		}
	}
}